

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

void * __thiscall IR::IndirOpnd::GetOriginalAddress(IndirOpnd *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void *pvVar4;
  
  if (this->m_addrKind == ~AddrOpndKindConstantAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0xb12,"(HasAddrKind())","HasAddrKind()");
    if (!bVar2) goto LAB_005aa1f4;
    *puVar3 = 0;
  }
  pvVar4 = this->m_originalAddress;
  if (pvVar4 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0xb14,"(m_originalAddress != nullptr)","m_originalAddress != nullptr");
    if (!bVar2) {
LAB_005aa1f4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pvVar4 = this->m_originalAddress;
  }
  return pvVar4;
}

Assistant:

void *
IndirOpnd::GetOriginalAddress() const
{
    Assert(HasAddrKind());
#if DBG_DUMP
    Assert(m_originalAddress != nullptr);
    return m_originalAddress;
#else
    return nullptr;
#endif
}